

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::LogisticSigmoid::backward_impl
          (LogisticSigmoid *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  int iVar27;
  int iVar28;
  ulong uVar13;
  
  uVar13 = (ulong)(fx->d).nd;
  iVar28 = 1;
  iVar27 = 1;
  if (uVar13 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar15));
      auVar20._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar24._4_4_;
      auVar20._0_4_ = (uint)(bVar9 & 1) * auVar24._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar24._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar24._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar24._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar24._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar24._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar24._28_4_;
      auVar20._32_4_ = (uint)(bVar10 & 1) * auVar24._32_4_;
      auVar20._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar24._36_4_;
      auVar20._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar24._40_4_;
      auVar20._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar24._44_4_;
      auVar20._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar24._48_4_;
      auVar20._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar24._52_4_;
      auVar20._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar24._56_4_;
      auVar20._60_4_ = (uint)(bVar10 >> 7) * auVar24._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar20,auVar25);
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar21._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar21._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar21._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar21,1);
    auVar20 = vpmulld_avx512f(auVar21,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar27 = auVar6._0_4_;
  }
  uVar11 = iVar27 * (fx->d).bd;
  uVar13 = (ulong)(dEdf->d).nd;
  if (uVar13 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
      auVar24._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar20._4_4_;
      auVar24._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar20._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar20._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar20._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar20._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar20._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar20._28_4_;
      auVar24._32_4_ = (uint)(bVar10 & 1) * auVar20._32_4_;
      auVar24._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar20._36_4_;
      auVar24._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar20._40_4_;
      auVar24._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar20._44_4_;
      auVar24._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar20._48_4_;
      auVar24._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar20._52_4_;
      auVar24._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar20._56_4_;
      auVar24._60_4_ = (uint)(bVar10 >> 7) * auVar20._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar24,auVar25);
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar22._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar22._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar22._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar22,1);
    auVar20 = vpmulld_avx512f(auVar22,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar28 = auVar6._0_4_;
  }
  if (uVar11 != iVar28 * (dEdf->d).bd) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<cnn::scalar_logistic_sigmoid_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::scalar_logistic_sigmoid_backward_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar13 = (ulong)(dEdxi->d).nd;
  if (uVar13 == 0) {
    iVar27 = 1;
  }
  else {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
      auVar26._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar20._4_4_;
      auVar26._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar20._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar20._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar20._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar20._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar20._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar20._28_4_;
      auVar26._32_4_ = (uint)(bVar10 & 1) * auVar20._32_4_;
      auVar26._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar20._36_4_;
      auVar26._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar20._40_4_;
      auVar26._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar20._44_4_;
      auVar26._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar20._48_4_;
      auVar26._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar20._52_4_;
      auVar26._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar20._56_4_;
      auVar26._60_4_ = (uint)(bVar10 >> 7) * auVar20._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar26,auVar25);
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar23._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar23._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar23._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar23,1);
    auVar20 = vpmulld_avx512f(auVar23,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar27 = auVar6._0_4_;
  }
  uVar12 = iVar27 * (dEdxi->d).bd;
  uVar13 = (ulong)uVar12;
  if (uVar12 != uVar11) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::scalar_logistic_sigmoid_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar2 = dEdxi->v;
  uVar15 = uVar13;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (uVar15 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar15)) {
    uVar15 = uVar13;
  }
  pfVar3 = fx->v;
  pfVar4 = dEdf->v;
  uVar16 = uVar13 - uVar15;
  uVar14 = uVar16 + 0xf;
  if (-1 < (long)uVar16) {
    uVar14 = uVar16;
  }
  if (uVar15 != 0) {
    uVar17 = 0;
    do {
      fVar1 = pfVar3[uVar17];
      auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)pfVar4[uVar17]),auVar6,ZEXT416((uint)pfVar2[uVar17]));
      pfVar2[uVar17] = auVar6._0_4_;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  uVar14 = (uVar14 & 0xfffffffffffffff0) + uVar15;
  if (0xf < (long)uVar16) {
    do {
      auVar20 = *(undefined1 (*) [64])(pfVar3 + uVar15);
      auVar20 = vfmsub213ps_avx512f(auVar20,auVar20,auVar20);
      auVar20 = vfnmadd213ps_avx512f
                          (auVar20,*(undefined1 (*) [64])(pfVar4 + uVar15),
                           *(undefined1 (*) [64])(pfVar2 + uVar15));
      *(undefined1 (*) [64])(pfVar2 + uVar15) = auVar20;
      uVar15 = uVar15 + 0x10;
    } while ((long)uVar15 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar13) {
    do {
      fVar1 = pfVar3[uVar14];
      auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)pfVar4[uVar14]),auVar6,ZEXT416((uint)pfVar2[uVar14]));
      pfVar2[uVar14] = auVar6._0_4_;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  return;
}

Assistant:

void LogisticSigmoid::backward_impl(const vector<const Tensor*>& xs,
                                 const Tensor& fx,
                                 const Tensor& dEdf,
                                 unsigned i,
                                 Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vlogistic_backward(dEdf.d.size(), fx.v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), scalar_logistic_sigmoid_backward_op<float>());
#endif
}